

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O3

bool __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::remove_path(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
              *this,RBPath *path)

{
  ulong *puVar1;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *pRVar2;
  uintptr_t *puVar3;
  bool bVar4;
  K r_nibling;
  ulong uVar5;
  ulong uVar6;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar7;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar8;
  CapPtr<snmalloc::FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  CVar9;
  RBStep *pRVar10;
  ulong uVar11;
  bool *pbVar12;
  ulong *puVar13;
  long lVar14;
  RBStep *pRVar15;
  byte bVar16;
  long lVar17;
  uint uVar18;
  Contents CVar19;
  ulong uVar20;
  
  uVar11 = path->length;
  uVar6 = uVar11 - 1;
  pFVar7 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)(path->path)._M_elems[uVar11 - 1].node.ptr.val;
  CVar9.unsafe_capptr = (pFVar7->left).unsafe_capptr;
  CVar19.unsafe_capptr = CVar9.unsafe_capptr & 0xfffffffffffffffe;
  uVar5 = uVar11;
  pFVar8 = pFVar7;
  if ((FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
       *)0x1 < ((CVar19.unsafe_capptr)->left).unsafe_capptr) {
    (path->path)._M_elems[uVar11].node.ptr.val = (uintptr_t *)CVar19.unsafe_capptr;
    (path->path)._M_elems[uVar11].dir = true;
    path->length = uVar11 + 1;
    CVar9.unsafe_capptr = ((CVar19.unsafe_capptr)->left).unsafe_capptr;
    uVar5 = uVar11 + 1;
    pFVar8 = CVar19.unsafe_capptr;
    uVar6 = uVar11;
    CVar19.unsafe_capptr = CVar9.unsafe_capptr & 0xfffffffffffffffe;
  }
  if ((FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
       *)0x1 < ((CVar19.unsafe_capptr)->right).unsafe_capptr) {
    pbVar12 = &(path->path)._M_elems[uVar5].dir;
    do {
      uVar6 = uVar5;
      pFVar8 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)&(CVar19.unsafe_capptr)->right;
      (((RBStep *)(pbVar12 + -8))->node).ptr.val = (uintptr_t *)pFVar8;
      *pbVar12 = false;
      uVar5 = uVar6 + 1;
      CVar9.unsafe_capptr =
           ((CapPtr<snmalloc::FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
             *)pFVar8)->unsafe_capptr;
      CVar19.unsafe_capptr = CVar9.unsafe_capptr & 0xfffffffffffffffe;
      pbVar12 = pbVar12 + 0x10;
    } while ((FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)0x1 < ((CVar19.unsafe_capptr)->right).unsafe_capptr);
    path->length = uVar5;
  }
  (pFVar8->left).unsafe_capptr =
       (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        *)((ulong)((uint)CVar9.unsafe_capptr & 1) |
          (ulong)((CVar19.unsafe_capptr)->left).unsafe_capptr & 0xfffffffffffffffe);
  pFVar8 = ((CVar19.unsafe_capptr)->right).unsafe_capptr;
  if ((FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
       *)(path->path)._M_elems[uVar6].node.ptr.val != pFVar7) {
    uVar6 = (ulong)(pFVar7->left).unsafe_capptr & 0xfffffffffffffffe;
    if (uVar6 == 0) {
      bVar4 = false;
    }
    else {
      bVar4 = (bool)(*(byte *)(uVar6 + 8) & 1);
    }
    BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
    ::set_red(CVar19,bVar4);
    ((CVar19.unsafe_capptr)->left).unsafe_capptr =
         (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          *)((ulong)((uint)((CVar19.unsafe_capptr)->left).unsafe_capptr & 1) |
            *(ulong *)((ulong)(pFVar7->left).unsafe_capptr & 0xfffffffffffffffe) &
            0xfffffffffffffffe);
    ((CVar19.unsafe_capptr)->right).unsafe_capptr =
         (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          *)((ulong)((uint)((CVar19.unsafe_capptr)->right).unsafe_capptr & 1) |
            *(ulong *)(((ulong)(pFVar7->left).unsafe_capptr & 0xfffffffffffffffe) + 8) &
            0xfffffffffffffffe);
    pFVar7->left = (CapPtr<snmalloc::FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                    )((ulong)((uint)(pFVar7->left).unsafe_capptr & 1) | CVar19.unsafe_capptr);
    uVar5 = path->length;
    if (1 < uVar5) {
      puVar13 = (path->path)._M_elems[0].node.ptr.val;
      pRVar10 = (path->path)._M_elems;
      uVar6 = 1;
      do {
        pRVar10 = pRVar10 + 1;
        puVar1 = (ulong *)((*puVar13 & 0xfffffffffffffffe) + (ulong)(pRVar10->dir ^ 1) * 8);
        puVar13 = (pRVar10->node).ptr.val;
        if (puVar1 != puVar13) {
          (pRVar10->node).ptr.val = puVar1;
          puVar13 = puVar1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
  }
  if (((ulong)pFVar8 & 1) == 0) {
    pRVar2 = (RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
              *)(path->path)._M_elems[uVar5 - 1].node.ptr.val;
    while (uVar6 = uVar5 - 1, pRVar2 != this) {
      pRVar15 = (path->path)._M_elems + (uVar5 - 1);
      pRVar10 = (path->path)._M_elems + (uVar5 - 2);
      uVar20 = *(pRVar10->node).ptr.val & 0xfffffffffffffffe;
      bVar4 = (path->path)._M_elems[uVar5 - 1].dir;
      uVar11 = (ulong)bVar4;
      lVar14 = uVar11 * 8;
      CVar19.unsafe_capptr =
           (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)(*(ulong *)(uVar20 + lVar14) & 0xfffffffffffffffe);
      uVar18 = (uint)*(ulong *)(uVar20 + lVar14);
      if ((CVar19.unsafe_capptr ==
           (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)0x0) || (((ulong)((CVar19.unsafe_capptr)->right).unsafe_capptr & 1) == 0)) {
        uVar5 = (ulong)(&(CVar19.unsafe_capptr)->left)[uVar11].unsafe_capptr & 0xfffffffffffffffe;
        if ((uVar5 != 0) && ((*(byte *)(uVar5 + 8) & 1) != 0)) {
          pFVar7 = (&(CVar19.unsafe_capptr)->left)[bVar4 ^ 1U].unsafe_capptr;
          (&(CVar19.unsafe_capptr)->left)[bVar4 ^ 1U].unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((uint)pFVar7 & 1 | uVar20);
          *(ulong *)(uVar20 + lVar14) =
               (ulong)((uint)*(undefined8 *)(uVar20 + lVar14) & 1) |
               (ulong)pFVar7 & 0xfffffffffffffffe;
          puVar13 = (pRVar10->node).ptr.val;
          *puVar13 = (ulong)((uint)*puVar13 & 1) | (ulong)CVar19.unsafe_capptr;
          if ((*(ulong *)(uVar5 + 8) & 1) != 0) {
            *(ulong *)(uVar5 + 8) = *(ulong *)(uVar5 + 8) & 0xfffffffffffffffe;
          }
          bVar16 = (byte)*(undefined4 *)(uVar20 + 8);
LAB_00107706:
          BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          ::set_red(CVar19,(bool)(bVar16 & 1));
          if ((*(ulong *)(uVar20 + 8) & 1) == 0) {
            return true;
          }
          *(ulong *)(uVar20 + 8) = *(ulong *)(uVar20 + 8) & 0xfffffffffffffffe;
          return true;
        }
        bVar16 = bVar4 ^ 1;
        pFVar7 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                  *)((ulong)(&(CVar19.unsafe_capptr)->left)[bVar16].unsafe_capptr &
                    0xfffffffffffffffe);
        if ((pFVar7 != (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                        *)0x0) && (((ulong)(pFVar7->right).unsafe_capptr & 1) != 0)) {
          pFVar8 = (&pFVar7->left)[uVar11].unsafe_capptr;
          *(ulong *)(uVar20 + lVar14) =
               (ulong)(uVar18 & 1) |
               (ulong)(&pFVar7->left)[bVar16].unsafe_capptr & 0xfffffffffffffffe;
          (&(CVar19.unsafe_capptr)->left)[bVar16].unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)((uint)(&(CVar19.unsafe_capptr)->left)[bVar16].unsafe_capptr & 1) |
                  (ulong)pFVar8 & 0xfffffffffffffffe);
          (&pFVar7->left)[bVar16].unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((uint)(&pFVar7->left)[bVar16].unsafe_capptr & 1 | uVar20);
          (&pFVar7->left)[uVar11].unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)((uint)(&pFVar7->left)[uVar11].unsafe_capptr & 1) |
                  (ulong)CVar19.unsafe_capptr);
          puVar13 = (pRVar10->node).ptr.val;
          *puVar13 = (ulong)((uint)*puVar13 & 1) | (ulong)pFVar7;
          bVar16 = (byte)*(undefined4 *)(uVar20 + 8);
          CVar19.unsafe_capptr = pFVar7;
          goto LAB_00107706;
        }
        if ((*(ulong *)(uVar20 + 8) & 1) != 0) {
          *(ulong *)(uVar20 + 8) = *(ulong *)(uVar20 + 8) & 0xfffffffffffffffe;
          pFVar7 = ((CVar19.unsafe_capptr)->right).unsafe_capptr;
          if (((ulong)pFVar7 & 1) != 0) {
            return true;
          }
          if (pFVar7 != (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                         *)0x0) {
            ((CVar19.unsafe_capptr)->right).unsafe_capptr =
                 (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                  *)((ulong)pFVar7 | 1);
            return true;
          }
          ((CVar19.unsafe_capptr)->right).unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)0x1;
          return true;
        }
        pFVar7 = ((CVar19.unsafe_capptr)->right).unsafe_capptr;
        if (((ulong)pFVar7 & 1) == 0) {
          if (pFVar7 == (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                         *)0x0) {
            ((CVar19.unsafe_capptr)->right).unsafe_capptr =
                 (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                  *)0x1;
          }
          else {
            ((CVar19.unsafe_capptr)->right).unsafe_capptr =
                 (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                  *)((ulong)pFVar7 | 1);
          }
        }
      }
      else {
        uVar11 = (ulong)(bVar4 ^ 1);
        lVar17 = uVar11 * 8;
        *(ulong *)(uVar20 + lVar14) =
             (ulong)(uVar18 & 1) |
             (ulong)(&(CVar19.unsafe_capptr)->left)[uVar11].unsafe_capptr & 0xfffffffffffffffe;
        (&(CVar19.unsafe_capptr)->left)[uVar11].unsafe_capptr =
             (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)((uint)(&(CVar19.unsafe_capptr)->left)[uVar11].unsafe_capptr & 1 | uVar20);
        if ((*(ulong *)(uVar20 + 8) & 1) == 0) {
          *(ulong *)(uVar20 + 8) = *(ulong *)(uVar20 + 8) | 1;
        }
        pFVar7 = ((CVar19.unsafe_capptr)->right).unsafe_capptr;
        if (((ulong)pFVar7 & 1) != 0) {
          ((CVar19.unsafe_capptr)->right).unsafe_capptr =
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)((ulong)pFVar7 & 0xfffffffffffffffe);
        }
        puVar3 = (pRVar10->node).ptr.val;
        *puVar3 = (ulong)((uint)*puVar3 & 1) | (ulong)CVar19.unsafe_capptr;
        uVar11 = *(pRVar10->node).ptr.val & 0xfffffffffffffffe;
        if (1 < *(ulong *)(uVar11 + lVar17)) {
          (pRVar15->node).ptr.val = (uintptr_t *)(uVar11 + lVar17);
          pRVar15->dir = bVar4;
          uVar6 = uVar5;
        }
        (path->path)._M_elems[uVar6].node.ptr.val =
             (uintptr_t *)
             ((*(path->path)._M_elems[uVar6 - 1].node.ptr.val & 0xfffffffffffffffe) + lVar17);
        (path->path)._M_elems[uVar6].dir = bVar4;
        uVar6 = uVar6 + 1;
      }
      path->length = uVar6;
      uVar5 = uVar6;
      pRVar2 = (RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                *)(path->path)._M_elems[uVar6 - 1].node.ptr.val;
    }
  }
  return true;
}

Assistant:

bool remove_path(RBPath& path)
    {
      ChildRef splice = path.curr();
      SNMALLOC_ASSERT(!(splice.is_null()));

      debug_log("Removing", path);

      /*
       * Find immediately smaller leaf element (rightmost descendant of left
       * child) to serve as the replacement for this node.  We may not have a
       * left subtree, so this may not move the path at all.
       */
      path.move(true);
      while (path.move(false))
      {}

      K curr = path.curr();

      {
        // Locally extract right-child-less replacement, replacing it with its
        // left child, if any
        K child = get_dir(true, path.curr());
        // Unlink target replacing with possible child.
        path.curr() = child;
      }

      bool leaf_red = Rep::is_red(curr);

      if (path.curr() != splice)
      {
        // If we had a left child, replace ourselves with the extracted value
        // from above
        Rep::set_red(curr, Rep::is_red(splice));
        get_dir(true, curr) = K{get_dir(true, splice)};
        get_dir(false, curr) = K{get_dir(false, splice)};
        splice = curr;
        path.fixup();
      }

      debug_log("Splice done", path);

      // TODO: Clear node contents?

      // Red leaf removal requires no rebalancing.
      if (leaf_red)
        return true;

      // Now in the double black case.
      // End of path is considered double black, that is, one black element
      // shorter than satisfies the invariant. The following algorithm moves up
      // the path until it finds a close red element or the root. If we convert
      // the tree to one, in which the root is double black, then the algorithm
      // is complete, as there is nothing to be out of balance with. Otherwise,
      // we are searching for nearby red elements so we can rotate the tree to
      // rebalance. The following slides nicely cover the case analysis below
      //   https://www.cs.purdue.edu/homes/ayg/CS251/slides/chap13c.pdf
      while (path.curr() != ChildRef(H{&root}))
      {
        K parent = path.parent();
        bool cur_dir = path.curr_dir();
        K sibling = get_dir(!cur_dir, parent);

        /* Handle red sibling case.
         * This performs a rotation to give a black sibling.
         *
         *         p                           s(b)
         *        / \                         /   \
         *       c   s(r)        -->         p(r)  m
         *          /  \                    / \
         *         n    m                  c   n
         *
         * By invariant we know that p, n and m are all initially black.
         */
        if (Rep::is_red(sibling))
        {
          debug_log("Red sibling", path, path.parent());
          K nibling = get_dir(cur_dir, sibling);
          get_dir(!cur_dir, parent) = nibling;
          get_dir(cur_dir, sibling) = parent;
          Rep::set_red(parent, true);
          Rep::set_red(sibling, false);
          path.parent() = sibling;
          // Manually fix path.  Using path.fixup would alter the complexity
          // class.
          path.pop();
          path.move(cur_dir);
          path.move_inc_null(cur_dir);
          path.fixup(false);
          debug_log("Red sibling - done", path, path.parent());
          continue;
        }

        /* Handle red nibling case 1.
         *          <p>                  <s>
         *          / \                  / \
         *         c   s         -->    p   rn
         *            / \              / \
         *          on   rn           c   on
         */
        if (Rep::is_red(get_dir(!cur_dir, sibling)))
        {
          debug_log("Red nibling 1", path, path.parent());
          K r_nibling = get_dir(!cur_dir, sibling);
          K o_nibling = get_dir(cur_dir, sibling);
          get_dir(cur_dir, sibling) = parent;
          get_dir(!cur_dir, parent) = o_nibling;
          path.parent() = sibling;
          Rep::set_red(r_nibling, false);
          Rep::set_red(sibling, Rep::is_red(parent));
          Rep::set_red(parent, false);
          debug_log("Red nibling 1 - done", path, path.parent());
          break;
        }

        /* Handle red nibling case 2.
         *         <p>                   <rn>
         *         / \                  /    \
         *        c   s         -->    p      s
         *           / \              / \    / \
         *         rn   on           c  rno rns on
         *         / \
         *       rno  rns
         */
        if (Rep::is_red(get_dir(cur_dir, sibling)))
        {
          debug_log("Red nibling 2", path, path.parent());
          K r_nibling = get_dir(cur_dir, sibling);
          K r_nibling_same = get_dir(cur_dir, r_nibling);
          K r_nibling_opp = get_dir(!cur_dir, r_nibling);
          get_dir(!cur_dir, parent) = r_nibling_same;
          get_dir(cur_dir, sibling) = r_nibling_opp;
          get_dir(cur_dir, r_nibling) = parent;
          get_dir(!cur_dir, r_nibling) = sibling;
          path.parent() = r_nibling;
          Rep::set_red(r_nibling, Rep::is_red(parent));
          Rep::set_red(parent, false);
          debug_log("Red nibling 2 - done", path, path.parent());
          break;
        }

        // Handle black sibling and niblings, and red parent.
        if (Rep::is_red(parent))
        {
          debug_log("Black sibling and red parent case", path, path.parent());
          Rep::set_red(parent, false);
          Rep::set_red(sibling, true);
          debug_log(
            "Black sibling and red parent case - done", path, path.parent());
          break;
        }
        // Handle black sibling and niblings and black parent.
        debug_log(
          "Black sibling, niblings and black parent case", path, path.parent());
        Rep::set_red(sibling, true);
        path.pop();
        invariant(path.curr());
        debug_log(
          "Black sibling, niblings and black parent case - done",
          path,
          path.curr());
      }
      return true;
    }